

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall geometrycentral::surface::SurfaceMesh::compressVertices(SurfaceMesh *this)

{
  undefined1 uVar1;
  bool bVar2;
  reference pvVar3;
  SurfaceMesh *in_RDI;
  function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)> *f;
  iterator __end2;
  iterator __begin2;
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  *__range2;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> oldIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newIndMap;
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  *in_stack_fffffffffffffef8;
  SurfaceMesh *in_stack_ffffffffffffff00;
  function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)> *this_00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  _Self local_b8;
  _Self in_stack_ffffffffffffff50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff58;
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  local_88;
  function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)> local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_20;
  
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x240a79);
  ::std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x240a9c);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             (size_type)in_stack_ffffffffffffff18,(value_type_conflict *)in_stack_ffffffffffffff10,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  ::std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x240ac9);
  for (local_70._M_invoker = (_Invoker_type)0x0;
      local_70._M_invoker < (_Invoker_type)in_RDI->nVerticesFillCount;
      local_70._M_invoker = local_70._M_invoker + 1) {
    in_stack_ffffffffffffff27 =
         vertexIsDead(in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
    if (!(bool)in_stack_ffffffffffffff27) {
      in_stack_ffffffffffffff18 = &local_20;
      in_stack_ffffffffffffff10 =
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     (in_stack_ffffffffffffff18);
      pvVar3 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_38,(size_type)local_70._M_invoker);
      *pvVar3 = (value_type)in_stack_ffffffffffffff10;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (in_stack_ffffffffffffff10,
                 (value_type_conflict *)
                 CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    }
  }
  applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
            (in_stack_ffffffffffffff58,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_ffffffffffffff50._M_node);
  this_00 = &local_70;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_ffffffffffffff10,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff10);
  uVar1 = usesImplicitTwin(in_RDI);
  if (!(bool)uVar1) {
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              (in_stack_ffffffffffffff58,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_ffffffffffffff50._M_node);
    in_stack_fffffffffffffef8 = &local_88;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (in_stack_ffffffffffffff10,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(uVar1,in_stack_ffffffffffffff08));
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff10)
    ;
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              (in_stack_ffffffffffffff58,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_ffffffffffffff50._M_node);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (in_stack_ffffffffffffff10,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(uVar1,in_stack_ffffffffffffff08));
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff10)
    ;
  }
  updateValues((SurfaceMesh *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  in_RDI->nVerticesFillCount = in_RDI->nVerticesCount;
  in_RDI->nVerticesCapacityCount = in_RDI->nVerticesCount;
  ::std::__cxx11::
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ::begin(in_stack_fffffffffffffef8);
  local_b8._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
       ::end(in_stack_fffffffffffffef8);
  while( true ) {
    bVar2 = ::std::operator!=((_Self *)&stack0xffffffffffffff50,&local_b8);
    if (!bVar2) break;
    ::std::
    _List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
    ::operator*((_List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
                 *)0x240d3b);
    ::std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>::
    operator()(this_00,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffef8);
    ::std::
    _List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
    ::operator++((_List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
                  *)&stack0xffffffffffffff50);
  }
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff10);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff10);
  return;
}

Assistant:

void SurfaceMesh::compressVertices() {
  // Build the compressing shift
  std::vector<size_t> newIndMap;                                  // maps new ind -> old ind
  std::vector<size_t> oldIndMap(nVerticesFillCount, INVALID_IND); // maps old ind -> new ind
  for (size_t i = 0; i < nVerticesFillCount; i++) {
    if (!vertexIsDead(i)) {
      oldIndMap[i] = newIndMap.size();
      newIndMap.push_back(i);
    }
  }


  // Permute & resize all per-vertex arrays
  vHalfedgeArr = applyPermutation(vHalfedgeArr, newIndMap);
  if (!usesImplicitTwin()) {
    vHeInStartArr = applyPermutation(vHeInStartArr, newIndMap);
    vHeOutStartArr = applyPermutation(vHeOutStartArr, newIndMap);
  }

  // Update indices in all vertex-valued arrays
  updateValues(heVertexArr, oldIndMap);

  // Update counts
  nVerticesFillCount = nVerticesCount;
  nVerticesCapacityCount = nVerticesCount;

  // Invoke callbacks
  for (auto& f : vertexPermuteCallbackList) {
    f(newIndMap);
  }
}